

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::velocity_advection_update(NavierStokesBase *this,Real dt)

{
  undefined8 uVar1;
  pointer pSVar2;
  FabArray<amrex::FArrayBox> *this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  FArrayBox *pFVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_02;
  TimeCenter TVar10;
  Arena *arena;
  long lVar11;
  long lVar12;
  DataAllocator arena_00;
  int *piVar13;
  double *pdVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  void *__s;
  long lVar30;
  long lVar31;
  _Head_base<0UL,_amrex::MultiFab_*,_false> _Var32;
  bool bVar33;
  Real RVar34;
  Real RVar35;
  ulong in_XMM0_Qb;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double *local_850;
  long local_848;
  long local_838;
  double *local_830;
  long local_800;
  Box local_7f4;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_7d8;
  long local_7d0;
  long local_7c8;
  ulong local_7c0;
  long local_7b8;
  int local_7ac;
  FArrayBox *local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_788;
  FabArray<amrex::FArrayBox> *local_780;
  long local_778;
  MFIter mfi;
  FArrayBox tforces;
  FArrayBox ScalFAB;
  Array4<double> local_590;
  undefined1 local_550 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_540;
  int local_528;
  Real local_3c8;
  Real RStack_3c0;
  Real local_3b8;
  ulong uStack_3b0;
  Array4<double> local_3a0;
  Array4<double> local_360;
  Array4<double> local_320;
  Array4<double> local_2e0;
  Elixir tf_i;
  Elixir scal_i;
  Array4<double> local_270;
  Array4<double> local_230;
  Array4<double> local_1f0;
  MultiFab Vel;
  
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  _Var32._M_head_impl =
       *(MultiFab **)
        &(pSVar2->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_7d8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar2->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  this_00 = &this->aofs->super_FabArray<amrex::FArrayBox>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar2[2].old_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_780 = &get_rho_half_time(this)->super_FabArray<amrex::FArrayBox>;
  local_550._0_8_ = (MultiFab *)0x1;
  local_550._8_8_ = (Arena *)0x0;
  vStack_540.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_540.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_540.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (&Vel,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,3,0,(MFInfo *)local_550
             ,(this->super_AmrLevel).m_factory._M_t.
              super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_540);
  local_550._0_8_ = this->u_mac;
  local_550._8_8_ = local_550._0_8_ + 0x180;
  vStack_540.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(local_550._0_8_ + 0x300);
  amrex::EB_average_face_to_cellcenter(&Vel,0,(Array<const_MultiFab_*,_3> *)local_550);
  amrex::FArrayBox::FArrayBox(&tforces);
  amrex::FArrayBox::FArrayBox(&ScalFAB);
  amrex::MFIter::MFIter(&mfi,&local_780->super_FabArrayBase,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_3b8 = -dt;
    uStack_3b0 = in_XMM0_Qb ^ 0x8000000000000000;
    local_788._M_head_impl = _Var32._M_head_impl;
    local_3c8 = dt;
    RStack_3c0 = dt;
    do {
      amrex::MFIter::tilebox(&local_7f4,&mfi);
      piVar13 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pFVar3 = Vel.super_FabArray<amrex::FArrayBox>.m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar13];
      amrex::FArrayBox::resize(&ScalFAB,&local_7f4,NUM_SCALARS,(Arena *)0x0);
      arena = (Arena *)CONCAT44(ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._4_4_,
                                ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_);
      if (arena == (Arena *)0x0) {
        arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir(&scal_i,(void *)0x0,arena);
      if (getForceVerbose != 0) {
        local_550._8_8_ = amrex::OutStream();
        local_550._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_550._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_540);
        *(undefined8 *)
         ((long)&vStack_540.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_540.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_550._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_550._8_8_)[-3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_540,"---",3);
        local_590.p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_540,(char *)&local_590,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_540,"F - velocity advection update (half time):",0x2a);
        local_590.p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_540,(char *)&local_590,1);
        amrex::Print::~Print((Print *)local_550);
      }
      iVar9 = ScalFAB.super_BaseFab<double>.domain.bigend.vect[2];
      iVar8 = ScalFAB.super_BaseFab<double>.domain.bigend.vect[1];
      iVar7 = ScalFAB.super_BaseFab<double>.domain.bigend.vect[0];
      iVar6 = ScalFAB.super_BaseFab<double>.domain.smallend.vect[2];
      iVar15 = ScalFAB.super_BaseFab<double>.domain.smallend.vect[1];
      iVar17 = ScalFAB.super_BaseFab<double>.domain.smallend.vect[0];
      local_850 = ScalFAB.super_BaseFab<double>.dptr;
      lVar28 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[0];
      lVar18 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[1];
      lVar11 = (long)ScalFAB.super_BaseFab<double>.domain.smallend.vect[2];
      local_7a8 = pFVar3;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_550,
                 (FabArray<amrex::FArrayBox> *)
                 local_7d8._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_590,&(local_788._M_head_impl)->super_FabArray<amrex::FArrayBox>,&mfi,3);
      local_790 = (long)NUM_SCALARS;
      if (0 < local_790) {
        lVar12 = (long)((iVar7 - iVar17) + 1);
        lVar26 = (long)local_7f4.smallend.vect[0];
        lVar29 = (long)local_7f4.smallend.vect[1];
        local_850 = local_850 + (lVar26 - lVar28);
        local_7b8 = (long)((iVar8 - iVar15) + 1) * 8;
        local_798 = ((iVar9 - iVar6) + 1) * lVar12 * local_7b8;
        local_848 = (lVar29 - local_590.begin.y) * local_590.jstride * 8 + lVar26 * 8 +
                    (long)local_590.begin.x * -8 + CONCAT71(local_590.p._1_7_,local_590.p._0_1_);
        local_7a0 = local_590.nstride * 8;
        local_800 = (lVar29 - vStack_540.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                    local_550._8_8_ * 8 + lVar26 * 8 +
                    (long)(int)vStack_540.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                    local_550._0_8_;
        local_7d0 = (long)vStack_540.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish * 8;
        local_7c0 = -(long)local_528;
        local_7c8 = CONCAT44(local_7c8._4_4_,local_7f4.smallend.vect[2]);
        lVar28 = 0;
        do {
          iVar17 = local_7f4.smallend.vect[2];
          if (local_7f4.smallend.vect[2] <= local_7f4.bigend.vect[2]) {
            do {
              if (local_7f4.smallend.vect[1] <= local_7f4.bigend.vect[1]) {
                lVar26 = (long)iVar17;
                pdVar14 = (double *)
                          (((lVar26 - lVar11) * local_7b8 + lVar29 * 8 + lVar18 * -8) * lVar12 +
                          (long)local_850);
                lVar19 = (lVar26 - local_590.begin.z) * local_590.kstride * 8 + local_848;
                lVar30 = (lVar26 + local_7c0) *
                         (long)vStack_540.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start * 8 + local_800;
                lVar26 = lVar29;
                do {
                  if (local_7f4.smallend.vect[0] <= local_7f4.bigend.vect[0]) {
                    lVar25 = 0;
                    do {
                      pdVar14[lVar25] =
                           (*(double *)(lVar30 + lVar25 * 8) + *(double *)(lVar19 + lVar25 * 8)) *
                           0.5;
                      lVar25 = lVar25 + 1;
                    } while ((local_7f4.bigend.vect[0] - local_7f4.smallend.vect[0]) + 1 !=
                             (int)lVar25);
                  }
                  lVar26 = lVar26 + 1;
                  pdVar14 = pdVar14 + lVar12;
                  lVar19 = lVar19 + local_590.jstride * 8;
                  lVar30 = lVar30 + local_550._8_8_ * 8;
                } while (local_7f4.bigend.vect[1] + 1U != (int)lVar26);
              }
              bVar33 = iVar17 != local_7f4.bigend.vect[2];
              iVar17 = iVar17 + 1;
            } while (bVar33);
          }
          lVar28 = lVar28 + 1;
          local_850 = (double *)((long)local_850 + local_798);
          local_848 = local_848 + local_7a0;
          local_800 = local_800 + local_7d0;
        } while (lVar28 != local_790);
      }
      pSVar2 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar10 = amrex::StateDescriptor::timeType(pSVar2->desc);
      if (TVar10 == Point) {
        RVar34 = (pSVar2->old_time).stop;
      }
      else {
        RVar34 = ((pSVar2->old_time).start + (pSVar2->old_time).stop) * 0.5;
      }
      pSVar2 = (this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar10 = amrex::StateDescriptor::timeType(pSVar2->desc);
      if (TVar10 == Point) {
        RVar35 = (pSVar2->new_time).stop;
      }
      else {
        RVar35 = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
      }
      amrex::FArrayBox::resize(&tforces,&local_7f4,3,(Arena *)0x0);
      arena_00 = tforces.super_BaseFab<double>.super_DataAllocator;
      if (tforces.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        arena_00.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir(&tf_i,(void *)0x0,arena_00.m_arena);
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
                ((RVar34 + RVar35) * 0.5,this,&tforces,&local_7f4,0,3,local_7a8,&ScalFAB,0,&mfi);
      pdVar14 = tforces.super_BaseFab<double>.dptr;
      iVar9 = local_7f4.bigend.vect[2];
      iVar8 = local_7f4.bigend.vect[1];
      iVar7 = local_7f4.bigend.vect[0];
      iVar6 = local_7f4.smallend.vect[2];
      iVar15 = local_7f4.smallend.vect[1];
      iVar17 = local_7f4.smallend.vect[0];
      if ((initial_iter != 0) &&
         (*is_diffusive.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          0)) {
        lVar18 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[0];
        lVar26 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[1];
        lVar12 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[0] -
                        tforces.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
        iVar21 = tforces.super_BaseFab<double>.domain.bigend.vect[1] -
                 tforces.super_BaseFab<double>.domain.smallend.vect[1];
        local_7c0 = (ulong)((tforces.super_BaseFab<double>.domain.bigend.vect[2] -
                            tforces.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
        lVar19 = (long)local_7f4.smallend.vect[0];
        lVar29 = (long)local_7f4.smallend.vect[1];
        uVar22 = local_7f4.bigend.vect[0] - local_7f4.smallend.vect[0];
        local_7b8 = CONCAT44(local_7b8._4_4_,
                             (local_7f4.bigend.vect[1] - local_7f4.smallend.vect[1]) + 1);
        lVar11 = lVar12 * 8;
        iVar24 = local_7f4.smallend.vect[2] - tforces.super_BaseFab<double>.domain.smallend.vect[2];
        local_838 = 0;
        lVar28 = 0;
        do {
          iVar20 = iVar24;
          iVar5 = iVar6;
          if (iVar6 <= iVar9) {
            do {
              if (iVar15 <= iVar8) {
                __s = (void *)((long)pdVar14 +
                              ((iVar20 + local_838) * (iVar21 + 1) * lVar12 + lVar19) * 8 +
                              (lVar29 - lVar26) * lVar11 + lVar18 * -8);
                iVar16 = (int)local_7b8;
                do {
                  if (iVar17 <= iVar7) {
                    memset(__s,0,(ulong)uVar22 * 8 + 8);
                  }
                  __s = (void *)((long)__s + lVar11);
                  iVar16 = iVar16 + -1;
                } while (iVar16 != 0);
              }
              bVar33 = iVar5 != iVar9;
              iVar20 = iVar20 + 1;
              iVar5 = iVar5 + 1;
            } while (bVar33);
          }
          lVar28 = lVar28 + 1;
          local_838 = local_838 + local_7c0;
        } while (lVar28 != 3);
      }
      this_02._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_7d8;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2e0,
                 (FabArray<amrex::FArrayBox> *)
                 local_7d8._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      _Var32._M_head_impl = (MultiFab *)local_788;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_320,&(local_788._M_head_impl)->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_360,
                 (FabArray<amrex::FArrayBox> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      local_830 = tforces.super_BaseFab<double>.dptr;
      lVar11 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[0];
      lVar18 = (long)tforces.super_BaseFab<double>.domain.smallend.vect[1];
      local_7a8 = (FArrayBox *)(long)tforces.super_BaseFab<double>.domain.smallend.vect[2];
      local_778 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[0] -
                         tforces.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
      local_7d0 = (long)((tforces.super_BaseFab<double>.domain.bigend.vect[1] -
                         tforces.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
      iVar15 = tforces.super_BaseFab<double>.domain.bigend.vect[2] -
               tforces.super_BaseFab<double>.domain.smallend.vect[2];
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_3a0,this_00,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1f0,
                 (FabArray<amrex::FArrayBox> *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_230,&(_Var32._M_head_impl)->super_FabArray<amrex::FArrayBox>,&mfi,3);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_270,local_780,&mfi);
      iVar17 = do_mom_diff;
      lVar28 = (long)local_7f4.smallend.vect[1];
      local_7b8 = (long)local_7f4.smallend.vect[0];
      local_830 = local_830 + (local_7b8 - lVar11);
      local_7c8 = (lVar28 - local_320.begin.y) * local_320.jstride * 8 + local_7b8 * 8 +
                  (long)local_320.begin.x * -8 + (long)local_320.p;
      local_790 = (lVar28 - local_360.begin.y) * local_360.jstride * 8 + local_7b8 * 8 +
                  (long)local_360.begin.x * -8 + (long)local_360.p;
      local_7d0 = local_7d0 * 8;
      local_7a8 = (FArrayBox *)-(long)local_7a8;
      local_798 = (lVar28 - local_3a0.begin.y) * local_3a0.jstride * 8 + local_7b8 * 8 +
                  (long)local_3a0.begin.x * -8 + (long)local_3a0.p;
      local_7a0 = (lVar28 - local_2e0.begin.y) * local_2e0.jstride * 8 + local_7b8 * 8 +
                  (long)local_2e0.begin.x * -8 + (long)local_2e0.p;
      local_7ac = local_7f4.smallend.vect[2];
      local_7c0 = (ulong)(uint)local_7f4.bigend.vect[1];
      lVar11 = 0;
      do {
        iVar6 = local_7f4.smallend.vect[2];
        if (local_7f4.smallend.vect[2] <= local_7f4.bigend.vect[2]) {
          do {
            if (local_7f4.smallend.vect[1] <= local_7f4.bigend.vect[1]) {
              lVar12 = (long)iVar6;
              lVar30 = (lVar12 - local_320.begin.z) * local_320.kstride * 8 + local_7c8;
              lVar26 = (lVar12 - local_360.begin.z) * local_360.kstride * 8 + local_790;
              lVar29 = (long)local_270.p +
                       (lVar12 - local_270.begin.z) * local_270.kstride * 8 +
                       (lVar28 - local_270.begin.y) * local_270.jstride * 8 + local_7b8 * 8 +
                       (long)local_270.begin.x * -8;
              pdVar14 = (double *)
                        ((((long)local_7a8 + lVar12) * local_7d0 + lVar28 * 8 + lVar18 * -8) *
                         local_778 + (long)local_830);
              lVar25 = (lVar12 - local_3a0.begin.z) * local_3a0.kstride * 8 + local_798;
              lVar23 = (long)local_230.p +
                       (lVar12 - local_230.begin.z) * local_230.kstride * 8 +
                       (lVar28 - local_230.begin.y) * local_230.jstride * 8 + local_7b8 * 8 +
                       (long)local_230.begin.x * -8;
              lVar31 = (long)local_1f0.p +
                       (lVar12 - local_1f0.begin.z) * local_1f0.kstride * 8 +
                       (lVar28 - local_1f0.begin.y) * local_1f0.jstride * 8 + local_7b8 * 8 +
                       (long)local_1f0.begin.x * -8;
              lVar19 = (lVar12 - local_2e0.begin.z) * local_2e0.kstride * 8 + local_7a0;
              lVar12 = lVar28;
              do {
                if (local_7f4.smallend.vect[0] <= local_7f4.bigend.vect[0]) {
                  lVar27 = 0;
                  do {
                    dVar38 = *(double *)(lVar19 + lVar27 * 8);
                    if (iVar17 == 0) {
                      auVar36._0_8_ = pdVar14[lVar27] * local_3c8;
                      auVar36._8_8_ = *(double *)(lVar26 + lVar27 * 8) * RStack_3c0;
                      uVar1 = *(undefined8 *)(lVar29 + lVar27 * 8);
                      auVar37._8_8_ = uVar1;
                      auVar37._0_8_ = uVar1;
                      auVar37 = divpd(auVar36,auVar37);
                      dVar38 = (*(double *)(lVar25 + lVar27 * 8) * local_3b8 + dVar38 +
                               auVar37._0_8_) - auVar37._8_8_;
                    }
                    else {
                      dVar38 = *(double *)(lVar26 + lVar27 * 8) * local_3b8 +
                               pdVar14[lVar27] * dt +
                               *(double *)(lVar25 + lVar27 * 8) * local_3b8 +
                               dVar38 * *(double *)(lVar31 + lVar27 * 8);
                      *(double *)(lVar30 + lVar27 * 8) = dVar38;
                      dVar38 = dVar38 / *(double *)(lVar23 + lVar27 * 8);
                    }
                    *(double *)(lVar30 + lVar27 * 8) = dVar38;
                    lVar27 = lVar27 + 1;
                  } while ((local_7f4.bigend.vect[0] - local_7f4.smallend.vect[0]) + 1 !=
                           (int)lVar27);
                }
                lVar12 = lVar12 + 1;
                lVar30 = lVar30 + local_320.jstride * 8;
                lVar26 = lVar26 + local_360.jstride * 8;
                lVar29 = lVar29 + local_270.jstride * 8;
                pdVar14 = pdVar14 + local_778;
                lVar25 = lVar25 + local_3a0.jstride * 8;
                lVar23 = lVar23 + local_230.jstride * 8;
                lVar31 = lVar31 + local_1f0.jstride * 8;
                lVar19 = lVar19 + local_2e0.jstride * 8;
              } while (local_7f4.bigend.vect[1] + 1U != (int)lVar12);
            }
            bVar33 = iVar6 != local_7f4.bigend.vect[2];
            iVar6 = iVar6 + 1;
          } while (bVar33);
        }
        lVar11 = lVar11 + 1;
        local_7c8 = local_7c8 + local_320.nstride * 8;
        local_790 = local_790 + local_360.nstride * 8;
        local_830 = (double *)((long)local_830 + (iVar15 + 1) * local_778 * local_7d0);
        local_798 = local_798 + local_3a0.nstride * 8;
        local_7a0 = local_7a0 + local_2e0.nstride * 8;
      } while (lVar11 != 3);
      amrex::Gpu::Elixir::~Elixir(&tf_i);
      amrex::Gpu::Elixir::~Elixir(&scal_i);
      amrex::MFIter::operator++(&mfi);
      _Var32._M_head_impl = local_788._M_head_impl;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  ScalFAB.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  amrex::BaseFab<double>::clear(&ScalFAB.super_BaseFab<double>);
  tforces.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  amrex::BaseFab<double>::clear(&tforces.super_BaseFab<double>);
  iVar17 = 0;
  do {
    bVar33 = amrex::MultiFab::contains_nan
                       ((MultiFab *)
                        local_7d8._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,iVar17,1,0,
                        false);
    if (bVar33) {
      local_550._8_8_ = amrex::OutStream();
      local_550._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_550._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_540);
      *(undefined8 *)
       ((long)&vStack_540.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_540.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_550._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_550._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_540,"VAU: Old velocity ",0x12);
      std::ostream::operator<<((ostringstream *)&vStack_540,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_540," contains Nans",0xe);
      cVar4 = (char)(ostringstream *)&vStack_540;
      std::ios::widen((char)vStack_540.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_550);
      ScalFAB.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x64ffffff9c;
      ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0xffffff9c;
      amrex::MFIter::MFIter
                (&mfi,(FabArrayBase *)
                      local_7d8._M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,'\0');
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox((Box *)&tforces.super_BaseFab<double>,&mfi);
        piVar13 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        bVar33 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                           ((((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)
                             ((long)local_7d8._M_t.
                                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                             0x108))->
                            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[*piVar13],
                            (Box *)&tforces.super_BaseFab<double>,iVar17,1,
                            (IntVect *)&ScalFAB.super_BaseFab<double>);
        if (bVar33) {
          local_550._8_8_ = amrex::OutStream();
          local_550._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_550._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_540);
          *(undefined8 *)
           ((long)&vStack_540.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           vStack_540.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_550._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_550._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_540," Nans at ",9);
          amrex::operator<<((ostream *)&vStack_540,(IntVect *)&ScalFAB.super_BaseFab<double>);
          cVar4 = (char)(ostringstream *)&vStack_540;
          std::ios::widen((char)vStack_540.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length +
                          cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          amrex::Print::~Print((Print *)local_550);
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
    bVar33 = amrex::MultiFab::contains_nan(_Var32._M_head_impl,iVar17,1,0,false);
    if (bVar33) {
      local_550._8_8_ = amrex::OutStream();
      local_550._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_550._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_540);
      *(undefined8 *)
       ((long)&vStack_540.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_540.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_550._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_550._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_540,"VAU: New velocity ",0x12);
      std::ostream::operator<<((ostringstream *)&vStack_540,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_540," contains Nans",0xe);
      cVar4 = (char)(ostringstream *)&vStack_540;
      std::ios::widen((char)vStack_540.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_550);
      ScalFAB.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x64ffffff9c;
      ScalFAB.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0xffffff9c;
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)_Var32._M_head_impl,'\0');
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox((Box *)&tforces.super_BaseFab<double>,&mfi);
        piVar13 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        bVar33 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                           (*(FArrayBox **)
                             (*(long *)((long)_Var32._M_head_impl + 0x108) + (long)*piVar13 * 8),
                            (Box *)&tforces.super_BaseFab<double>,iVar17,1,
                            (IntVect *)&ScalFAB.super_BaseFab<double>);
        if (bVar33) {
          local_550._8_8_ = amrex::OutStream();
          local_550._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_550._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_540);
          *(undefined8 *)
           ((long)&vStack_540.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           vStack_540.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_550._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_550._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_540," Nans at ",9);
          amrex::operator<<((ostream *)&vStack_540,(IntVect *)&ScalFAB.super_BaseFab<double>);
          cVar4 = (char)(ostringstream *)&vStack_540;
          std::ios::widen((char)vStack_540.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length +
                          cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          amrex::Print::~Print((Print *)local_550);
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 != 3);
  amrex::MultiFab::~MultiFab(&Vel);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection_update (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection_update()");

    MultiFab&  U_old          = get_old_data(State_Type);
    MultiFab&  U_new          = get_new_data(State_Type);
    MultiFab&  Aofs           = *aofs;
    MultiFab&  Gp    = get_old_data(Gradp_Type);
    MultiFab& Rh = get_rho_half_time();

    MultiFab Vel(grids, dmap, AMREX_SPACEDIM, 0, MFInfo(), Factory());
    //
    // Average mac face velocity to cell-centers for use in generating external
    // forcing term in getForce()
    // NOTE that default getForce() does not use Vel or Scal, user must supply the
    // forcing function for that case.
    //
#ifdef AMREX_USE_EB
    // FIXME - this isn't quite right because it's face-centers to cell-centers
    // what's really wanted is face-centroid to cell-centroid
    EB_average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#else
    average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
    FArrayBox  tforces, ScalFAB;

    for (MFIter mfi(Rh,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        FArrayBox& VelFAB = Vel[mfi];
        ScalFAB.resize(bx,NUM_SCALARS);
        Elixir scal_i = ScalFAB.elixir();

        //
        // Need to do some funky half-time stuff.
        //
        if (getForceVerbose)
           amrex::Print() << "---" << '\n' << "F - velocity advection update (half time):" << '\n';
        //
        // Average the new and old time to get Crank-Nicholson half time approximation.
        // Scalars always get updated before velocity (see NavierStokes::advance), so
        // this is garanteed to be good.
        //
        auto const& scal = ScalFAB.array();
        auto const& scal_o = U_old.array(mfi,Density);
        auto const& scal_n = U_new.array(mfi,Density);
        amrex::ParallelFor(bx, NUM_SCALARS, [scal, scal_o, scal_n]
	AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            scal(i,j,k,n) = 0.5 * ( scal_o(i,j,k,n) + scal_n(i,j,k,n) );
        });

        const Real half_time = 0.5*(state[State_Type].prevTime()+state[State_Type].curTime());
        tforces.resize(bx,AMREX_SPACEDIM);
        Elixir tf_i = tforces.elixir();
        getForce(tforces,bx,Xvel,AMREX_SPACEDIM,half_time,VelFAB,ScalFAB,0,mfi);

        //
        // Do following only at initial iteration--per JBB.
        //
        if (initial_iter && is_diffusive[Xvel]) {
           auto const& force  = tforces.array();
           amrex::ParallelFor(bx, AMREX_SPACEDIM, [force]
	   AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
           {
	       force(i,j,k,n) = 0.0;
           });
        }

        // Update velocity
        auto const& vel_old  = U_old.array(mfi);
        auto const& vel_new  = U_new.array(mfi);
        auto const& gradp    = Gp.array(mfi);
        auto const& force    = tforces.array();
        auto const& advec    = Aofs.array(mfi);
        auto const& rho_old  = U_old.array(mfi, Density);
        auto const& rho_new  = U_new.array(mfi, Density);
        auto const& rho_Half = Rh.array(mfi);
        int mom_diff = do_mom_diff;
        amrex::ParallelFor(bx, AMREX_SPACEDIM, [vel_old,vel_new,gradp,force,advec,rho_old,rho_new,rho_Half,mom_diff,dt]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real velold = vel_old(i,j,k,n);

            if ( mom_diff ) {
               velold *= rho_old(i,j,k);
	       vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
		                         + dt * force(i,j,k,n)
		                         - dt * gradp(i,j,k,n);

	       vel_new(i,j,k,n) /= rho_new(i,j,k);
            }
	    else
	    {
	        vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
                                          + dt * force(i,j,k,n) / rho_Half(i,j,k)
                                          - dt * gradp(i,j,k,n) / rho_Half(i,j,k);
            }
        });
    }
}

    for (int sigma = 0; sigma < AMREX_SPACEDIM; sigma++)
    {
       if (U_old.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: Old velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_old); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_old[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
       if (U_new.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: New velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_new); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_new[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
    }
}